

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseTrue
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  long lVar1;
  long lVar2;
  
  (*this->ow_->_vptr_ObjectWriter[6])(this->ow_,(this->key_).ptr_,(this->key_).length_,1);
  (this->key_).ptr_ = (char *)0x0;
  (this->key_).length_ = 0;
  lVar1 = (this->p_).length_;
  lVar2 = lVar1 - DAT_003c7fe0;
  if (DAT_003c7fe0 <= lVar1) {
    (this->p_).ptr_ = (this->p_).ptr_ + DAT_003c7fe0;
    (this->p_).length_ = lVar2;
    Status::Status(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __assert_fail("length_ >= n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/stringpiece.h"
                ,0x11b,"void google::protobuf::StringPiece::remove_prefix(stringpiece_ssize_type)");
}

Assistant:

util::Status JsonStreamParser::ParseTrue() {
  ow_->RenderBool(key_, true);
  key_ = StringPiece();
  p_.remove_prefix(kKeywordTrue.length());
  return util::Status();
}